

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImporterT.hh
# Opt level: O2

VertexHandle __thiscall
OpenMesh::IO::ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_>::add_vertex
          (ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_> *this)

{
  VertexHandle VVar1;
  
  VVar1 = ArrayKernel::new_vertex((ArrayKernel *)this->mesh_);
  return (VertexHandle)VVar1.super_BaseHandle.idx_;
}

Assistant:

virtual VertexHandle add_vertex()
  {
    return mesh_.new_vertex();
  }